

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

vector<const_char_*,_std::allocator<const_char_*>_> *
EnvProperty::DoDuplicateAndUpdateEnv
          (vector<const_char_*,_std::allocator<const_char_*>_> *__return_storage_ptr__,
          override_set *overrides)

{
  iterator iVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 extraout_RAX;
  uint uVar8;
  size_type_conflict __n;
  long lVar9;
  long lVar10;
  vector<char_const*,std::allocator<char_const*>> *this;
  ptrdiff_t _Num;
  ulong uVar11;
  undefined8 *puVar12;
  size_t *psVar13;
  char *local_50;
  char *new_k_and_v;
  char **local_40;
  vector<char_const*,std::allocator<char_const*>> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = _environ;
  pcVar7 = *_environ;
  new_k_and_v = (char *)overrides;
  local_38 = (vector<char_const*,std::allocator<char_const*>> *)__return_storage_ptr__;
  while( true ) {
    if (pcVar7 == (char *)0x0) {
      puVar12 = *(undefined8 **)new_k_and_v;
      local_40 = *(char ***)(new_k_and_v + 8);
      this = local_38;
      if ((char **)puVar12 != local_40) {
        do {
          if (puVar12[5] != 0) {
            uVar11 = puVar12[5] + puVar12[1] + 2;
            pcVar7 = (char *)operator_new__(uVar11);
            sVar5 = puVar12[1];
            local_50 = pcVar7;
            if (sVar5 != 0) {
              memmove(pcVar7,(void *)*puVar12,sVar5);
            }
            pcVar6 = pcVar7 + sVar5 + 1;
            pcVar7[sVar5] = '=';
            sVar5 = puVar12[5];
            if (sVar5 != 0) {
              memmove(pcVar6,(void *)puVar12[4],sVar5);
            }
            this = local_38;
            pcVar6[sVar5] = '\0';
            if (pcVar6 + sVar5 + 1 != pcVar7 + uVar11) {
              DoDuplicateAndUpdateEnv();
              pvVar2 = *(void **)local_38;
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,*(long *)(local_38 + 0x10) - (long)pvVar2);
              }
              _Unwind_Resume(extraout_RAX);
            }
            iVar1._M_current = *(char ***)(local_38 + 8);
            if (iVar1._M_current == *(char ***)(local_38 + 0x10)) {
              std::vector<char_const*,std::allocator<char_const*>>::
              _M_realloc_insert<char_const*const&>(local_38,iVar1,&local_50);
            }
            else {
              *iVar1._M_current = pcVar7;
              *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
            }
          }
          puVar12 = puVar12 + 8;
        } while ((char **)puVar12 != local_40);
      }
      local_50 = (char *)0x0;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                (this,&local_50);
      return (vector<const_char_*,_std::allocator<const_char_*>_> *)this;
    }
    sVar5 = strlen(pcVar7);
    if (sVar5 == 0) break;
    pcVar6 = (char *)memchr(pcVar7,0x3d,sVar5);
    if ((pcVar6 == (char *)0x0) ||
       (uVar11 = (long)pcVar6 - (long)pcVar7, uVar11 == 0xffffffffffffffff)) break;
    if (sVar5 < uVar11) {
      uVar11 = sVar5;
    }
    uVar8 = (int)((ulong)(*(long *)(new_k_and_v + 8) - *(long *)new_k_and_v) >> 6) - 1;
    if (-1 < (int)uVar8) {
      psVar13 = (size_t *)(*(long *)new_k_and_v + (ulong)uVar8 * 0x40 + 8);
      lVar9 = (ulong)uVar8 + 1;
      do {
        if (*psVar13 == uVar11) {
          if (pcVar6 == pcVar7) goto LAB_00116e0d;
          iVar4 = bcmp((void *)psVar13[-1],pcVar7,uVar11);
          if (iVar4 == 0) goto LAB_00116e0d;
        }
        psVar13 = psVar13 + -8;
        lVar10 = lVar9 + -1;
        bVar3 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar3);
    }
    iVar1._M_current = *(char ***)(local_38 + 8);
    if (iVar1._M_current == *(char ***)(local_38 + 0x10)) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                (local_38,iVar1,local_40);
    }
    else {
      *iVar1._M_current = pcVar7;
      *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
    }
LAB_00116e0d:
    pcVar7 = local_40[1];
    local_40 = local_40 + 1;
  }
  syscall(1,2,"Check failed: pos != std::string_view::npos\n",0x2c);
  abort();
}

Assistant:

static std::vector<const char*> DoDuplicateAndUpdateEnv(override_set overrides) {
    std::vector<const char*> vec;

    for (const char* const *p = environ; *p; p++) {
      std::string_view k_and_v{*p};
      auto pos = k_and_v.find('=');
      CHECK(pos != std::string_view::npos);
      std::string_view k = k_and_v.substr(0, pos);
      int i = overrides.size() - 1;;
      for (; i >= 0; i--) {
        if (overrides[i].first == k) {
          break;
        }
      }
      if (i < 0) {
        vec.push_back(*p);
      }
    }

    for (const auto& [k, v] : overrides) {
      if (v.empty()) {
        continue;
      }

      size_t sz = k.size() + v.size() + 1 + 1;
      char* new_k_and_v = new char[sz];
      auto it = std::copy(k.begin(), k.end(), new_k_and_v);
      *it++ = '=';
      it = std::copy(v.begin(), v.end(), it);
      *it++ = '\0';
      CHECK_EQ(it, new_k_and_v + sz);

      vec.push_back(new_k_and_v);
    }

    vec.push_back(nullptr);

    return vec;
  }